

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.c
# Opt level: O0

int ip_str_to_ip(AP_CTX *ctx,char *ip_str,uint32_t *ip)

{
  uint local_3c;
  uint local_38;
  uint i;
  uint ip_bytes [4];
  int rc_os;
  int rc;
  uint32_t *ip_local;
  char *ip_str_local;
  AP_CTX *ctx_local;
  
  ip_bytes[3] = 0;
  *ip = 0;
  ip_bytes[2] = __isoc99_sscanf(ip_str,"%u.%u.%u.%u",&local_38,&i,ip_bytes,ip_bytes + 1);
  if (ip_bytes[2] == 4) {
    for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
      if (0xff < (&local_38)[local_3c]) {
        ap_log(AP_LOG_LEVEL_ERROR,"(%s) Invalid ip address \'%s\'\n",ctx->client_ip,ip_str);
        return 0xb;
      }
      *ip = *ip << 8 | (&local_38)[local_3c];
    }
  }
  else {
    ap_log(AP_LOG_LEVEL_ERROR,"(%s) Invalid ip address \'%s\'\n",ctx->client_ip,ip_str);
    ip_bytes[3] = 0xb;
  }
  return ip_bytes[3];
}

Assistant:

static int ip_str_to_ip (AP_CTX *ctx, const char *ip_str, uint32_t *ip)
{
    int				rc				= AP_NO_ERROR;
	int				rc_os;
	unsigned int	ip_bytes[4];
	unsigned int	i;

	*ip = 0;

	rc_os = sscanf (ip_str, "%u.%u.%u.%u", &ip_bytes[0], &ip_bytes[1], &ip_bytes[2], &ip_bytes[3]);
    if (rc_os != 4)
	{
		ap_error ("(%s) Invalid ip address '%s'\n", ctx->client_ip, ip_str);
		rc = AP_ERROR_IP_NOT_VALID;
        
		goto finish;
	}
 
	for (i = 0; i < 4; i ++)
	{
		if (ip_bytes[i] > 255)
		{
			ap_error ("(%s) Invalid ip address '%s'\n", ctx->client_ip, ip_str);
			rc = AP_ERROR_IP_NOT_VALID;
        
			goto finish;
		}

		*ip = (*ip << 8) | ip_bytes[i];
	}

finish:
    return rc;
}